

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxBoxes.cpp
# Opt level: O1

MultiFab ** __thiscall FluxBoxes::define(FluxBoxes *this,AmrLevel *amr_level,int nvar,int nghost)

{
  MultiFab **ppMVar1;
  BoxArray *bxs;
  MultiFab *this_00;
  long lVar2;
  MFInfo local_58;
  
  ppMVar1 = (MultiFab **)operator_new__(0x18);
  this->data = ppMVar1;
  lVar2 = 0;
  do {
    bxs = amrex::AmrLevel::getEdgeBoxArray(amr_level,(int)lVar2);
    this_00 = (MultiFab *)operator_new(0x180);
    local_58.alloc = true;
    local_58._1_7_ = 0;
    local_58.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58.arena = (Arena *)0x0;
    local_58.tags.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    amrex::MultiFab::MultiFab
              (this_00,bxs,&amr_level->dmap,nvar,nghost,&local_58,
               (amr_level->m_factory)._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    this->data[lVar2] = this_00;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58.tags.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  return this->data;
}

Assistant:

MultiFab**
FluxBoxes::define (const AmrLevel* amr_level, int nvar, int nghost)
{
    BL_ASSERT(data == 0);
    data = new MultiFab*[BL_SPACEDIM];
    for (int dir = 0; dir < BL_SPACEDIM; dir++)
    {
	const BoxArray& ba = amr_level->getEdgeBoxArray(dir);
        const DistributionMapping& dm = amr_level->DistributionMap();
        data[dir] = new MultiFab(ba,dm,nvar,nghost,MFInfo(),amr_level->Factory());
    }
    return data;
}